

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

char * log_medium_to_str(LOG_MEDIUM medium)

{
  char *pcStack_10;
  LOG_MEDIUM medium_local;
  
  switch(medium) {
  case LOG_MEDIUM_NONE:
    pcStack_10 = "Void";
    break;
  case LOG_MEDIUM_STDOUT:
    pcStack_10 = "Console";
    break;
  case LOG_MEDIUM_FILE:
    pcStack_10 = "Log File";
    break;
  case LOG_MEDIUM_SYSLOG:
    pcStack_10 = "Syslog";
    break;
  case LOG_MEDIUM_EVENTLOG:
    pcStack_10 = "Event Log";
    break;
  default:
    pcStack_10 = "Unknown Medium";
  }
  return pcStack_10;
}

Assistant:

const char *log_medium_to_str(enum LOG_MEDIUM medium)
{
	switch (medium) {
	case LOG_MEDIUM_NONE:
		return "Void";
	case LOG_MEDIUM_STDOUT:
		return "Console";
	case LOG_MEDIUM_FILE:
		return "Log File";
	case LOG_MEDIUM_SYSLOG:
		return "Syslog";
	case LOG_MEDIUM_EVENTLOG:
		return "Event Log";
	default:
		return "Unknown Medium";
	}
}